

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O1

StringRef __thiscall
mp::internal::TextReader<fmt::Locale>::ReadString(TextReader<fmt::Locale> *this)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  StringRef SVar5;
  ArgList local_40;
  
  iVar1 = ReadUInt<int>(this);
  pcVar2 = (this->super_ReaderBase).ptr_;
  if (*pcVar2 != ':') {
    local_40.types_ = 0;
    DoReportError(this,pcVar2,(CStringRef)0x396730,&local_40);
  }
  pcVar4 = (this->super_ReaderBase).ptr_ + 1;
  (this->super_ReaderBase).ptr_ = pcVar4;
  pcVar2 = pcVar4;
  if (0 < iVar1) {
    iVar3 = iVar1;
    do {
      if (*pcVar2 == '\0') {
        if (pcVar2 == (this->super_ReaderBase).end_) {
          local_40.types_ = 0;
          DoReportError(this,pcVar2,(CStringRef)0x39673d,&local_40);
        }
      }
      else if (*pcVar2 == '\n') {
        this->line_start_ = pcVar2 + 1;
        this->line_ = this->line_ + 1;
      }
      pcVar2 = (this->super_ReaderBase).ptr_ + 1;
      (this->super_ReaderBase).ptr_ = pcVar2;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  if (*pcVar2 != '\n') {
    local_40.types_ = 0;
    DoReportError(this,pcVar2,(CStringRef)0x39200f,&local_40);
  }
  this->line_ = this->line_ + 1;
  pcVar2 = (this->super_ReaderBase).ptr_ + 1;
  if (iVar1 == 0) {
    pcVar4 = (char *)0x0;
  }
  (this->super_ReaderBase).ptr_ = pcVar2;
  this->line_start_ = pcVar2;
  SVar5.size_ = (size_t)iVar1;
  SVar5.data_ = pcVar4;
  return SVar5;
}

Assistant:

fmt::StringRef mp::internal::TextReader<Locale>::ReadString() {
  int length = ReadUInt();
  if (*ptr_ != ':')
    DoReportError(ptr_, "expected ':'");
  ++ptr_;
  const char *start = ptr_;
  for (int i = 0; i < length; ++i, ++ptr_) {
    char c = *ptr_;
    if (c == '\n') {
      line_start_ = ptr_  + 1;
      ++line_;
    } else if (!c && ptr_ == end_) {
      DoReportError(ptr_, "unexpected end of file in string");
    }
  }
  if (*ptr_ != '\n')
    DoReportError(ptr_, "expected newline");
  ++line_;
  line_start_ = ++ptr_;
  return fmt::StringRef(length != 0 ? start : 0, length);
}